

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

Abc_Obj_t * Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *pOrigObj)

{
  Abc_Ntk_t *pNtkNew;
  int iVar1;
  int in_RAX [2];
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Mem_Flex_t *pMan;
  int fCompl [2];
  
  if (pOrigObj == (Abc_Obj_t *)0x0) {
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x2e8,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
  }
  pNtkNew = pManMR->pInitNtk;
  if ((*(Abc_ObjType_t *)&pOrigObj->field_0x14 & (ABC_OBJ_LATCH|ABC_OBJ_NET)) != ABC_OBJ_BI) {
    if (pManMR->pNtk->ntkType == ABC_NTK_STRASH) {
      iVar1 = Abc_AigNodeIsConst(pOrigObj);
      if (iVar1 != 0) {
        pAVar2 = Abc_NtkCreateNodeConst1(pNtkNew);
        return pAVar2;
      }
      if ((*(uint *)&pOrigObj->field_0x14 & 0xf) == 7) {
        pAVar2 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
        fCompl = (int  [2])
                 (CONCAT44(*(uint *)&pOrigObj->field_0x14 >> 0xb,
                           *(uint *)&pOrigObj->field_0x14 >> 10) & 0x100000001);
        pcVar3 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,2,fCompl);
        if (pcVar3 == (char *)0x0) {
          __assert_fail("pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x307,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
        }
        pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
LAB_0040dc43:
        pcVar3 = Abc_SopRegister(pMan,pcVar3);
        (pAVar2->field_5).pData = pcVar3;
        return pAVar2;
      }
      if ((pOrigObj->vFanins).nSize != 1) {
        __assert_fail("Abc_ObjFaninNum(pOrigObj) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x2fa,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
      }
    }
    else {
      if (pManMR->pNtk->ntkFunc != ABC_FUNC_MAP) {
        pAVar2 = Abc_NtkDupObj(pNtkNew,pOrigObj,0);
        *(uint *)&pAVar2->field_0x14 =
             *(uint *)&pAVar2->field_0x14 & 0xffffff7f | *(uint *)&pOrigObj->field_0x14 & 0x80;
        return pAVar2;
      }
      if ((pOrigObj->field_5).pData != (void *)0x0) {
        fCompl = in_RAX;
        pAVar2 = Abc_NtkCreateObj(pNtkNew,*(Abc_ObjType_t *)&pOrigObj->field_0x14 &
                                          (ABC_OBJ_LATCH|ABC_OBJ_NODE));
        pcVar3 = Mio_GateReadSop((Mio_Gate_t *)(pOrigObj->field_5).pData);
        iVar1 = Abc_SopGetVarNum(pcVar3);
        if (iVar1 != (pOrigObj->vFanins).nSize) {
          __assert_fail("Abc_SopGetVarNum((char*)pData) == Abc_ObjFaninNum(pOrigObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x318,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
        }
        pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
        goto LAB_0040dc43;
      }
      if ((pOrigObj->vFanins).nSize != 1) {
        __assert_fail("Abc_ObjFaninNum(pOrigObj) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x30f,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
      }
    }
  }
  pAVar2 = Abc_NtkCreateNodeBuf(pNtkNew,(Abc_Obj_t *)0x0);
  Abc_FlowRetime_ClearInitToOrig(pAVar2);
  return pAVar2;
}

Assistant:

Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk( Abc_Obj_t *pOrigObj ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Ntk_t *pInitNtk = pManMR->pInitNtk;
  Abc_Obj_t *pInitObj;
  void *pData;
  int fCompl[2];

  assert(pOrigObj);

  // what we do depends on the ntk types of original / init networks...
  
  // (0) convert BI/BO nodes to buffers
  if (Abc_ObjIsBi( pOrigObj ) || Abc_ObjIsBo( pOrigObj ) ) {
    pInitObj =  Abc_NtkCreateNodeBuf( pInitNtk, NULL );
    Abc_FlowRetime_ClearInitToOrig( pInitObj );
    return pInitObj;
  }

  // (i) strash node -> SOP node
  if (Abc_NtkIsStrash( pNtk )) {

    if (Abc_AigNodeIsConst( pOrigObj )) {
      return Abc_NtkCreateNodeConst1( pInitNtk );
    }
    if (!Abc_ObjIsNode( pOrigObj )) {
      assert(Abc_ObjFaninNum(pOrigObj) == 1);
      pInitObj =  Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pInitObj );
      return pInitObj;
    }

    assert( Abc_ObjIsNode(pOrigObj) );
    pInitObj = Abc_NtkCreateObj( pInitNtk, ABC_OBJ_NODE );
    
    fCompl[0] = pOrigObj->fCompl0 ? 1 : 0;
    fCompl[1] = pOrigObj->fCompl1 ? 1 : 0;
    
    pData =  Abc_SopCreateAnd( (Mem_Flex_t *)pInitNtk->pManFunc, 2, fCompl );
    assert(pData);
    pInitObj->pData = Abc_SopRegister( (Mem_Flex_t *)pInitNtk->pManFunc, (const char*)pData );
  } 

  // (ii) mapped node -> SOP node
  else if (Abc_NtkHasMapping( pNtk )) {
    if (!pOrigObj->pData) {
      // assume terminal...
      assert(Abc_ObjFaninNum(pOrigObj) == 1);

      pInitObj =  Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pInitObj );
      return pInitObj;
    }

    pInitObj = Abc_NtkCreateObj( pInitNtk, (Abc_ObjType_t)Abc_ObjType(pOrigObj) );
    pData = Mio_GateReadSop((Mio_Gate_t*)pOrigObj->pData);
    assert( Abc_SopGetVarNum((char*)pData) == Abc_ObjFaninNum(pOrigObj) );
    
    pInitObj->pData = Abc_SopRegister( (Mem_Flex_t *)pInitNtk->pManFunc, (const char*)pData );
  } 

  // (iii) otherwise, duplicate obj
  else {
    pInitObj = Abc_NtkDupObj( pInitNtk, pOrigObj, 0 );
    
    // copy phase
    pInitObj->fPhase = pOrigObj->fPhase;
  }

  assert(pInitObj);
  return pInitObj;
}